

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::clear
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this)

{
  allocator_type *__a;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RDI;
  pointer p;
  
  for (__a = (allocator_type *)in_RDI->m_begin; __a != (allocator_type *)in_RDI->m_end;
      __a = __a + 8) {
    get_alloc(in_RDI);
    std::allocator_traits<std::allocator<double>_>::destroy<double>(__a,(double *)in_RDI);
  }
  in_RDI->m_end = in_RDI->m_begin;
  return;
}

Assistant:

void clear() noexcept
    {
        for (auto p = m_begin; p != m_end; ++p)
        {
            atraits::destroy(get_alloc(), p);
        }

        if (RevertToStaticSize > 0)
        {
            m_begin = m_end = static_begin_ptr();
            m_capacity = StaticCapacity;
        }
        else
        {
            m_end = m_begin;
        }
    }